

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

int __thiscall
ddd::DictionaryMLT<true,_true>::stat(DictionaryMLT<true,_true> *this,char *__file,stat *__buf)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  *(undefined8 *)__file = *(undefined8 *)(this + 0x30);
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  plVar2 = *(long **)(this + 8);
  uVar1 = *(uint *)((long)plVar2 + 100);
  lVar10 = plVar2[2];
  lVar3 = *plVar2;
  lVar9 = plVar2[1];
  auVar13._8_4_ = (int)lVar3;
  auVar13._0_8_ = lVar3;
  auVar13._12_4_ = (int)((ulong)lVar3 >> 0x20);
  uVar14 = (ulong)(plVar2[1] - lVar3) >> 3;
  *(ulong *)(__file + 0x10) = (ulong)((int)uVar14 - uVar1);
  *(ulong *)(__file + 0x18) = uVar14 & 0xffffffff;
  *(ulong *)(__file + 0x20) = (ulong)(lVar10 - auVar13._8_8_) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x28) = (ulong)uVar1;
  lVar10 = plVar2[3];
  lVar15 = plVar2[5];
  auVar18._8_4_ = (int)lVar10;
  auVar18._0_8_ = lVar10;
  auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
  lVar11 = plVar2[4];
  *(ulong *)(__file + 0x30) = plVar2[4] - lVar10 & 0xffffffff;
  *(ulong *)(__file + 0x38) = lVar15 - auVar18._8_8_ & 0xffffffff;
  *(ulong *)(__file + 0x40) = (ulong)*(uint *)(plVar2 + 0xd);
  *(long *)(__file + 0x48) =
       ((lVar9 + lVar11 + plVar2[7] + plVar2[10]) - (lVar3 + lVar10 + plVar2[6] + plVar2[9])) + 0x2c
  ;
  lVar3 = *(long *)(this + 0x10);
  if (*(long *)(this + 0x18) - lVar3 != 0) {
    lVar9 = *(long *)(__file + 0x48);
    lVar10 = *(long *)(__file + 0x40);
    lVar15 = *(long *)(__file + 0x30);
    lVar16 = *(long *)(__file + 0x38);
    lVar11 = *(long *)(__file + 0x28);
    lVar17 = *(long *)(__file + 8);
    lVar19 = *(long *)(__file + 0x10);
    lVar20 = *(long *)(__file + 0x18);
    lVar21 = *(long *)(__file + 0x20);
    lVar8 = *(long *)(this + 0x18) - lVar3 >> 3;
    lVar12 = 0;
    do {
      plVar2 = *(long **)(lVar3 + lVar12 * 8);
      if (plVar2 != (long *)0x0) {
        uVar1 = *(uint *)((long)plVar2 + 100);
        lVar4 = *plVar2;
        lVar5 = plVar2[1];
        auVar22._8_4_ = (int)lVar4;
        auVar22._0_8_ = lVar4;
        auVar22._12_4_ = (int)((ulong)lVar4 >> 0x20);
        uVar14 = (ulong)(plVar2[1] - lVar4) >> 3;
        lVar20 = lVar20 + (uVar14 & 0xffffffff);
        lVar21 = lVar21 + ((ulong)(plVar2[2] - auVar22._8_8_) >> 3 & 0xffffffff);
        *(long *)(__file + 0x18) = lVar20;
        *(long *)(__file + 0x20) = lVar21;
        lVar11 = lVar11 + (ulong)uVar1;
        *(long *)(__file + 0x28) = lVar11;
        lVar6 = plVar2[3];
        auVar23._8_4_ = (int)lVar6;
        auVar23._0_8_ = lVar6;
        auVar23._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar15 = lVar15 + (plVar2[4] - lVar6 & 0xffffffffU);
        lVar16 = lVar16 + (plVar2[5] - auVar23._8_8_ & 0xffffffffU);
        lVar7 = plVar2[4];
        *(long *)(__file + 0x30) = lVar15;
        *(long *)(__file + 0x38) = lVar16;
        lVar10 = lVar10 + (ulong)*(uint *)(plVar2 + 0xd);
        *(long *)(__file + 0x40) = lVar10;
        lVar9 = lVar9 + ((lVar5 + lVar7 + plVar2[7] + plVar2[10]) -
                        (lVar4 + lVar6 + plVar2[6] + plVar2[9])) + 0x2c;
        lVar17 = lVar17 + 1;
        lVar19 = lVar19 + (ulong)((int)uVar14 - uVar1);
        *(long *)(__file + 8) = lVar17;
        *(long *)(__file + 0x10) = lVar19;
      }
      lVar9 = lVar9 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar12);
    *(long *)(__file + 0x48) = lVar9;
  }
  *(long *)(__file + 0x48) = *(long *)(__file + 0x48) + 0x14;
  return (int)lVar3;
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }